

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TxFormats.cpp
# Opt level: O0

void __thiscall jbcoin::TxFormats::addCommonFields(TxFormats *this,Item *item)

{
  Item *pIVar1;
  SOElement local_f8;
  SOElement local_e8;
  SOElement local_d8;
  SOElement local_c8;
  SOElement local_b8;
  SOElement local_a8;
  SOElement local_98;
  SOElement local_88;
  SOElement local_78;
  SOElement local_68;
  SOElement local_58;
  SOElement local_48;
  SOElement local_38;
  SOElement local_28;
  Item *local_18;
  Item *item_local;
  TxFormats *this_local;
  
  local_18 = item;
  item_local = (Item *)this;
  SOElement::SOElement(&local_28,(SField *)sfTransactionType,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(item,&local_28);
  SOElement::SOElement(&local_38,(SField *)sfFlags,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_38);
  SOElement::SOElement(&local_48,(SField *)sfSourceTag,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_48);
  SOElement::SOElement(&local_58,(SField *)sfAccount,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_58);
  SOElement::SOElement(&local_68,(SField *)sfSequence,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_68);
  SOElement::SOElement(&local_78,(SField *)sfPreviousTxnID,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_78);
  SOElement::SOElement(&local_88,(SField *)sfLastLedgerSequence,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_88);
  SOElement::SOElement(&local_98,(SField *)sfAccountTxnID,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_98);
  SOElement::SOElement(&local_a8,(SField *)sfFee,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_a8);
  SOElement::SOElement(&local_b8,(SField *)sfOperationLimit,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_b8);
  SOElement::SOElement(&local_c8,(SField *)sfMemos,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_c8);
  SOElement::SOElement(&local_d8,(SField *)sfSigningPubKey,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_d8);
  SOElement::SOElement(&local_e8,(SField *)sfTxnSignature,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_e8);
  SOElement::SOElement(&local_f8,(SField *)sfSigners,SOE_OPTIONAL);
  KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_f8);
  return;
}

Assistant:

void TxFormats::addCommonFields (Item& item)
{
    item
        << SOElement(sfTransactionType,     SOE_REQUIRED)
        << SOElement(sfFlags,               SOE_OPTIONAL)
        << SOElement(sfSourceTag,           SOE_OPTIONAL)
        << SOElement(sfAccount,             SOE_REQUIRED)
        << SOElement(sfSequence,            SOE_REQUIRED)
        << SOElement(sfPreviousTxnID,       SOE_OPTIONAL) // emulate027
        << SOElement(sfLastLedgerSequence,  SOE_OPTIONAL)
        << SOElement(sfAccountTxnID,        SOE_OPTIONAL)
        << SOElement(sfFee,                 SOE_REQUIRED)
        << SOElement(sfOperationLimit,      SOE_OPTIONAL)
        << SOElement(sfMemos,               SOE_OPTIONAL)
        << SOElement(sfSigningPubKey,       SOE_REQUIRED)
        << SOElement(sfTxnSignature,        SOE_OPTIONAL)
        << SOElement(sfSigners,             SOE_OPTIONAL) // submit_multisigned
        ;
}